

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

Node * __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::ParseLiteral
          (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this,EncodedChar *input,
          EncodedChar *inputLim,CharCount *outBodyEncodedChars,CharCount *outTotalEncodedChars,
          CharCount *outBodyChars,CharCount *outTotalChars,RegexFlags *flags)

{
  ParseError *pPVar1;
  EncodedChar *pEVar2;
  code *pcVar3;
  bool bVar4;
  CharCount CVar5;
  CharCount CVar6;
  undefined4 *puVar7;
  ScriptConfiguration *this_00;
  undefined8 *puVar8;
  Node *pNVar9;
  Node *root;
  EncodedChar *pastOptions;
  CharCount *outBodyChars_local;
  CharCount *outTotalEncodedChars_local;
  CharCount *outBodyEncodedChars_local;
  EncodedChar *inputLim_local;
  EncodedChar *input_local;
  Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this_local;
  
  if (input == (EncodedChar *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xb40,"(input != 0)","input != 0");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (inputLim < input) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xb41,"(inputLim >= input)","inputLim >= input");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  SetPosition(this,input,inputLim,true);
  PatternPass0(this);
  CVar5 = Chars<char16_t>::OSB(this->next,input);
  *outBodyEncodedChars = CVar5;
  CVar5 = Pos(this);
  *outBodyChars = CVar5;
  ECMust(this,L'/',-0x7ff5fc0c);
  Options(this,flags);
  this->unicodeFlagPresent = (*flags & UnicodeRegexFlag) == UnicodeRegexFlag;
  this->caseInsensitiveFlagPresent = (*flags & IgnoreCaseRegexFlag) == IgnoreCaseRegexFlag;
  this->dotAllFlagPresent = (*flags & DotAllRegexFlag) == DotAllRegexFlag;
  if ((this->unicodeFlagPresent & 1U) != 0) {
    this_00 = Js::ScriptContext::GetConfig(this->scriptContext);
    bVar4 = Js::ScriptConfiguration::IsES6UnicodeExtensionsEnabled(this_00);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xb54,
                         "(!this->unicodeFlagPresent || scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())"
                         ,
                         "!this->unicodeFlagPresent || scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled()"
                        );
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
  }
  if ((this->deferredIfNotUnicodeError != (ParseError *)0x0) &&
     ((this->unicodeFlagPresent & 1U) == 0)) {
    puVar8 = (undefined8 *)__cxa_allocate_exception(0x10);
    pPVar1 = this->deferredIfNotUnicodeError;
    *puVar8 = *(undefined8 *)pPVar1;
    puVar8[1] = *(undefined8 *)&pPVar1->encodedPos;
    __cxa_throw(puVar8,&ParseError::typeinfo,0);
  }
  if ((this->deferredIfUnicodeError != (ParseError *)0x0) && ((this->unicodeFlagPresent & 1U) != 0))
  {
    puVar8 = (undefined8 *)__cxa_allocate_exception(0x10);
    pPVar1 = this->deferredIfUnicodeError;
    *puVar8 = *(undefined8 *)pPVar1;
    puVar8[1] = *(undefined8 *)&pPVar1->encodedPos;
    __cxa_throw(puVar8,&ParseError::typeinfo,0);
  }
  pEVar2 = this->next;
  this->currentSurrogatePairNode = this->surrogatePairList;
  SetPosition(this,input,inputLim,true);
  pNVar9 = PatternPass1(this);
  CVar5 = *outBodyEncodedChars;
  CVar6 = Chars<char16_t>::OSB(this->next,input);
  if (CVar5 != CVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xb68,"(outBodyEncodedChars == Chars<EncodedChar>::OSB(next, input))",
                       "outBodyEncodedChars == Chars<EncodedChar>::OSB(next, input)");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  CVar5 = *outBodyChars;
  CVar6 = Pos(this);
  if (CVar5 != CVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xb69,"(outBodyChars == Pos())","outBodyChars == Pos()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  this->next = pEVar2;
  CVar5 = Chars<char16_t>::OSB(this->next,input);
  *outTotalEncodedChars = CVar5;
  CVar5 = Pos(this);
  *outTotalChars = CVar5;
  return pNVar9;
}

Assistant:

Node* Parser<P, IsLiteral>::ParseLiteral
        ( const EncodedChar* input
        , const EncodedChar* inputLim
        , CharCount& outBodyEncodedChars
        , CharCount& outTotalEncodedChars
        , CharCount& outBodyChars
        , CharCount& outTotalChars
        , RegexFlags& flags )
    {
        Assert(IsLiteral);
        Assert(input != 0);
        Assert(inputLim >= input); // *inputLim need not be 0 because of deferred parsing

        // To handle surrogate pairs properly under unicode option, we will collect information on location of the pairs
        // during pass 0, regardless if the option is present. (We aren't able to get it at that time)
        // During pass 1, we will use that information to correctly create appropriate nodes.

        // Body, pass 0
        SetPosition(input, inputLim, true);

        PatternPass0();
        outBodyEncodedChars = Chars<EncodedChar>::OSB(next, input);
        outBodyChars = Pos();

        // Options are needed for the next pass
        ECMust('/', ERRnoSlash);
        Options(flags);
        this->unicodeFlagPresent = (flags & UnifiedRegex::UnicodeRegexFlag) == UnifiedRegex::UnicodeRegexFlag;
        this->caseInsensitiveFlagPresent = (flags & UnifiedRegex::IgnoreCaseRegexFlag) == UnifiedRegex::IgnoreCaseRegexFlag;
        this->dotAllFlagPresent = (flags & UnifiedRegex::DotAllRegexFlag) == UnifiedRegex::DotAllRegexFlag;
        Assert(!this->unicodeFlagPresent || scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled());

        // If this HR has been set, that means we have an earlier failure than the one caught above.
        if (this->deferredIfNotUnicodeError != nullptr && !this->unicodeFlagPresent)
        {
            throw ParseError(*deferredIfNotUnicodeError);
        }
        else if(this->deferredIfUnicodeError != nullptr && this->unicodeFlagPresent)
        {
            throw ParseError(*deferredIfUnicodeError);
        }

        // Used below to proceed to the end of the regex
        const EncodedChar *pastOptions = next;

        this->currentSurrogatePairNode = this->surrogatePairList;

        // Body, pass 1
        SetPosition(input, inputLim, true);
        Node* root = PatternPass1();
        Assert(outBodyEncodedChars == Chars<EncodedChar>::OSB(next, input));
        Assert(outBodyChars == Pos());

        next = pastOptions;
        outTotalEncodedChars = Chars<EncodedChar>::OSB(next, input);
        outTotalChars = Pos();

        return root;
    }